

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::
     log<char_const(&)[69],kj::_::DebugComparison<kj::_::(anonymous_namespace)::SiPair&,kj::_::(anonymous_namespace)::SiPair>&>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [69],
               DebugComparison<kj::_::(anonymous_namespace)::SiPair_&,_kj::_::(anonymous_namespace)::SiPair>
               *params_1)

{
  undefined4 in_register_00000014;
  long lVar1;
  char argValues [2] [7];
  kj local_30 [24];
  
  str<char_const(&)[69]>
            ((String *)argValues,(kj *)CONCAT44(in_register_00000014,severity),
             (char (*) [69])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<kj::_::(anonymous_namespace)::SiPair&,kj::_::(anonymous_namespace)::SiPair>&>
            (local_30,(DebugComparison<kj::_::(anonymous_namespace)::SiPair_&,_kj::_::(anonymous_namespace)::SiPair>
                       *)macroArgs);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,line._0_4_,argValues[0],_argValues);
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)(argValues[0] + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}